

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void speak_sync(OpenJTalk *oj)

{
  SpeakData *pSVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  PaStream *stream;
  PaStreamParameters outputParameters;
  
  if (g_verbose) {
    console_message(anon_var_dwarf_54d);
  }
  pSVar1 = g_psd;
  g_psd->finished = false;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  outputParameters.device = Pa_GetDefaultOutputDevice();
  if (outputParameters.device != -1) {
    outputParameters.channelCount = 1;
    outputParameters.sampleFormat = 8;
    lVar3 = Pa_GetDeviceInfo(outputParameters.device);
    outputParameters.suggestedLatency = *(PaTime *)(lVar3 + 0x28);
    outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
    iVar2 = Pa_OpenStream(((double)CONCAT44(0x45300000,(int)(g_psd->sampling_frequency >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)g_psd->sampling_frequency) -
                          4503599627370496.0),&stream,0,&outputParameters,0x400,1,0,0);
    if (iVar2 == 0) {
      g_psd->speaking = true;
      iVar2 = Pa_StartStream(stream);
      if (iVar2 == 0) {
        uVar4 = 0;
        do {
          if ((g_psd->length <= uVar4) || (g_psd->stop != false)) break;
          iVar2 = Pa_WriteStream(stream,g_psd->data + uVar4,0x400);
          uVar4 = (ulong)((int)uVar4 + 0x400);
        } while (iVar2 == 0);
        Pa_CloseStream(stream);
      }
    }
  }
  if (g_psd->data != (short *)0x0) {
    free(g_psd->data);
    g_psd->data = (short *)0x0;
  }
  pSVar1 = g_psd;
  g_psd->finished = true;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  if (g_verbose == true) {
    console_message(anon_var_dwarf_a33 + 3);
  }
  return;
}

Assistant:

void speak_sync(OpenJTalk *oj)
{
	if (g_verbose)
	{
		console_message(u8"同期発声開始\n");
	}

	g_psd->finished = false;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	PaStreamParameters outputParameters;
	PaStream *stream;
	PaError err;

	outputParameters.device = Pa_GetDefaultOutputDevice();
	if (outputParameters.device == paNoDevice)
	{
		goto exit_func;
	}
	outputParameters.channelCount = 1;
	outputParameters.sampleFormat = paInt16;
	outputParameters.suggestedLatency = Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
	outputParameters.hostApiSpecificStreamInfo = NULL;

	err = Pa_OpenStream(&stream, NULL, &outputParameters, (double)g_psd->sampling_frequency, OPENJTALK_BLOCKSIZE, paClipOff, NULL, NULL);
	if (err != paNoError)
	{
		goto exit_func;
	}

	g_psd->speaking = true;
	err = Pa_StartStream(stream);
	if (err != paNoError)
	{
		goto exit_func;
	}

	for (unsigned int i = 0; i * OPENJTALK_BLOCKSIZE < g_psd->length; i++)
	{
		if (g_psd->stop)
		{
			break;
		}

		err = Pa_WriteStream(stream, &g_psd->data[i * OPENJTALK_BLOCKSIZE], OPENJTALK_BLOCKSIZE);
		if (err != paNoError)
		{
			break;
		}
	}
	Pa_CloseStream(stream);

exit_func:
	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}

	g_psd->finished = true;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	if (g_verbose)
	{
		console_message(u8"同期発声完了\n");
	}
}